

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

int doup(void)

{
  xchar xVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((((u.ux == (level->upstair).sx) && (u.uy == (level->upstair).sy)) ||
      ((cVar2 = (level->upladder).sx, u.ux == cVar2 && cVar2 != '\0' &&
       (u.uy == (level->upladder).sy)))) ||
     (((cVar2 = (level->sstairs).sx, u.ux == cVar2 && cVar2 != '\0' && (u.uy == (level->sstairs).sy)
       ) && ((level->sstairs).up != '\0')))) {
    if (u.usteed != (monst *)0x0) {
      if (((u.usteed)->field_0x62 & 4) == 0) {
        pcVar5 = Monnam(u.usteed);
        pcVar6 = "%s won\'t move!";
LAB_0016d455:
        pline(pcVar6,pcVar5);
        return 0;
      }
      if ((u.usteed)->meating != 0) {
        pcVar5 = Monnam(u.usteed);
        pcVar6 = "%s is still eating.";
        goto LAB_0016d455;
      }
    }
    if (u.ustuck == (monst *)0x0) {
      iVar4 = near_capacity();
      if (iVar4 < 2) {
        xVar1 = ledger_no(&u.uz);
        if ((xVar1 == '\x01') &&
           (cVar2 = yn_function("Beware, there will be no return! Still climb?","yn",'n'),
           cVar2 != 'y')) {
          return 0;
        }
        bVar3 = next_to_u();
        if (bVar3 != '\0') {
          at_ladder = level->locations[u.ux][u.uy].typ == '\x1b';
          prev_level('\x01');
          at_ladder = '\0';
          return 1;
        }
        pcVar5 = "You are held back by your pet!";
        goto LAB_0016d437;
      }
      pcVar5 = "ladder";
      if (level->locations[u.ux][u.uy].typ == '\x1a') {
        pcVar5 = "stairs";
      }
      pcVar6 = "Your load is too heavy to climb the %s.";
    }
    else {
      if ((u._1052_1_ & 1) == 0) {
        pcVar5 = "being held";
      }
      else {
        pcVar5 = "swallowed";
        if (((u.ustuck)->data->mflags1 & 0x40000) == 0) {
          pcVar5 = "engulfed";
        }
      }
      pcVar6 = "You are %s, and cannot go up.";
    }
    pline(pcVar6,pcVar5);
  }
  else {
    bVar3 = try_escape_trap(u.ux,u.uy,'\0','\0');
    if (bVar3 == '\0') {
      pcVar5 = "You can\'t go up here.";
LAB_0016d437:
      pline(pcVar5);
      return 0;
    }
  }
  return 1;
}

Assistant:

int doup(void)
{
	if ( (u.ux != level->upstair.sx || u.uy != level->upstair.sy)
	     && (!level->upladder.sx || u.ux != level->upladder.sx || u.uy != level->upladder.sy)
	     && (!level->sstairs.sx || u.ux != level->sstairs.sx || u.uy != level->sstairs.sy
			|| !level->sstairs.up)
	  ) {
		if (try_escape_trap(u.ux, u.uy, 0, 0))
			return 1;
		pline("You can't go up here.");
		return 0;
	}
	if (u.usteed && !u.usteed->mcanmove) {
		pline("%s won't move!", Monnam(u.usteed));
		return 0;
	} else if (u.usteed && u.usteed->meating) {
		pline("%s is still eating.", Monnam(u.usteed));
		return 0;
	} else if (u.ustuck) {
		pline("You are %s, and cannot go up.",
			!u.uswallow ? "being held" : is_animal(u.ustuck->data) ?
			"swallowed" : "engulfed");
		return 1;
	}
	if (near_capacity() > SLT_ENCUMBER) {
		/* No levitation check; inv_weight() already allows for it */
		pline("Your load is too heavy to climb the %s.",
			level->locations[u.ux][u.uy].typ == STAIRS ? "stairs" : "ladder");
		return 1;
	}
	if (ledger_no(&u.uz) == 1) {
		if (yn("Beware, there will be no return! Still climb?") != 'y')
			return 0;
	}
	if (!next_to_u()) {
		pline("You are held back by your pet!");
		return 0;
	}
	at_ladder = (boolean) (level->locations[u.ux][u.uy].typ == LADDER);
	prev_level(TRUE);
	at_ladder = FALSE;
	return 1;
}